

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  exception *e;
  Pl_Base64 decode;
  undefined1 local_58 [8];
  Pl_OStream out;
  action_e action;
  char **argv_local;
  int argc_local;
  
  if (argc != 2) {
    usage();
  }
  QUtil::binary_stdout();
  QUtil::binary_stdin();
  out.m._M_t.super___uniq_ptr_impl<Pl_OStream::Members,_std::default_delete<Pl_OStream::Members>_>.
  _M_t.super__Tuple_impl<0UL,_Pl_OStream::Members_*,_std::default_delete<Pl_OStream::Members>_>.
  super__Head_base<0UL,_Pl_OStream::Members_*,_false>._M_head_impl._4_4_ = a_decode;
  iVar2 = strcmp(argv[1],"encode");
  if (iVar2 == 0) {
    out.m._M_t.super___uniq_ptr_impl<Pl_OStream::Members,_std::default_delete<Pl_OStream::Members>_>
    ._M_t.super__Tuple_impl<0UL,_Pl_OStream::Members_*,_std::default_delete<Pl_OStream::Members>_>.
    super__Head_base<0UL,_Pl_OStream::Members_*,_false>._M_head_impl._4_4_ = a_encode;
  }
  else {
    iVar2 = strcmp(argv[1],"decode");
    if (iVar2 != 0) {
      usage();
    }
  }
  Pl_OStream::Pl_OStream((Pl_OStream *)local_58,"stdout",(ostream *)&std::cout);
  Pl_Base64::Pl_Base64
            ((Pl_Base64 *)&e,"decode",(Pipeline *)local_58,
             out.m._M_t.
             super___uniq_ptr_impl<Pl_OStream::Members,_std::default_delete<Pl_OStream::Members>_>.
             _M_t.
             super__Tuple_impl<0UL,_Pl_OStream::Members_*,_std::default_delete<Pl_OStream::Members>_>
             .super__Head_base<0UL,_Pl_OStream::Members_*,_false>._M_head_impl._4_4_);
  bVar1 = write_some(_stdin,1,(Pipeline *)&e);
  if (((((bVar1) && (bVar1 = write_some(_stdin,4,(Pipeline *)&e), bVar1)) &&
       (bVar1 = write_some(_stdin,2,(Pipeline *)&e), bVar1)) &&
      ((bVar1 = write_some(_stdin,2,(Pipeline *)&e), bVar1 &&
       (bVar1 = write_some(_stdin,7,(Pipeline *)&e), bVar1)))) &&
     ((bVar1 = write_some(_stdin,1,(Pipeline *)&e), bVar1 &&
      ((bVar1 = write_some(_stdin,9,(Pipeline *)&e), bVar1 &&
       (bVar1 = write_some(_stdin,2,(Pipeline *)&e), bVar1)))))) {
    do {
      bVar1 = write_some(_stdin,1000,(Pipeline *)&e);
    } while (bVar1);
  }
  Pl_Base64::~Pl_Base64((Pl_Base64 *)&e);
  Pl_OStream::~Pl_OStream((Pl_OStream *)local_58);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 2) {
        usage();
    }
    QUtil::binary_stdout();
    QUtil::binary_stdin();
    Pl_Base64::action_e action = Pl_Base64::a_decode;
    if (strcmp(argv[1], "encode") == 0) {
        action = Pl_Base64::a_encode;
    } else if (strcmp(argv[1], "decode") != 0) {
        usage();
    }

    try {
        Pl_OStream out("stdout", std::cout);
        Pl_Base64 decode("decode", &out, action);
        // The comments are "n: n%4 n%3", where n is the number of
        // bytes read at the end of the call, and are there to
        // indicate that we are reading in chunks that exercise
        // various boundary conditions around subsequent writes and
        // the state of buf and pos. There are some writes that don't
        // do flush at all, some that call flush multiple times, and
        // some that start in the middle and do flush, and this is
        // true for both encode and decode.
        if (write_some(stdin, 1, &decode) && //  1: 1 1
            write_some(stdin, 4, &decode) && //  5: 1 2
            write_some(stdin, 2, &decode) && //  7: 3 1
            write_some(stdin, 2, &decode) && //  9: 1 0
            write_some(stdin, 7, &decode) && // 16: 0 1
            write_some(stdin, 1, &decode) && // 17: 1 2
            write_some(stdin, 9, &decode) && // 26: 2 2
            write_some(stdin, 2, &decode)) { // 28: 0 1
            while (write_some(stdin, 1000, &decode)) {
            }
        }
    } catch (std::exception& e) {
        std::cout << "exception: " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}